

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossibleParamAssignment(TokenKind kind)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,kind);
  if ((iVar2 != 0x1a) && (iVar2 != 0x1c)) {
    bVar1 = isPossibleExpression(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleParamAssignment(TokenKind kind) {
    // allow a comma here to handle cases like:  foo #(, 3);
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}